

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

char * cmsys::SystemTools::RemoveChars(char *str,char *toremove)

{
  char cVar1;
  char cVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  
  if (str == (char *)0x0) {
    return (char *)0x0;
  }
  sVar3 = strlen(str);
  pcVar4 = (char *)operator_new__(sVar3 + 1);
  cVar1 = *str;
  pcVar5 = pcVar4;
  do {
    pcVar6 = toremove;
    if (cVar1 == '\0') {
      *pcVar5 = '\0';
      return pcVar4;
    }
    do {
      cVar2 = *pcVar6;
      if (cVar2 == '\0') break;
      pcVar6 = pcVar6 + 1;
    } while (cVar1 != cVar2);
    if (cVar2 == '\0') {
      *pcVar5 = cVar1;
      pcVar5 = pcVar5 + 1;
    }
    cVar1 = str[1];
    str = str + 1;
  } while( true );
}

Assistant:

char* SystemTools::RemoveChars(const char* str, const char *toremove)
{
  if (!str)
    {
    return NULL;
    }
  char *clean_str = new char [strlen(str) + 1];
  char *ptr = clean_str;
  while (*str)
    {
    const char *str2 = toremove;
    while (*str2 && *str != *str2)
      {
      ++str2;
      }
    if (!*str2)
      {
      *ptr++ = *str;
      }
    ++str;
    }
  *ptr = '\0';
  return clean_str;
}